

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  sqlite3 *psVar4;
  Parse *pPVar5;
  int iVar6;
  size_t sVar7;
  u8 uVar8;
  int iVar9;
  char *__dest;
  uint uVar10;
  u16 uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (z == (char *)0x0) {
    if ((pMem->flags & 0x2400) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    iVar6 = 0;
  }
  else {
    psVar4 = pMem->db;
    if (psVar4 == (sqlite3 *)0x0) {
      iVar9 = 1000000000;
    }
    else {
      iVar9 = psVar4->aLimit[0];
    }
    uVar12 = 2;
    if (enc == '\0') {
      uVar12 = 0x10;
    }
    if (n < 0) {
      if (enc == '\x01') {
        sVar7 = strlen(z);
        uVar13 = (ulong)((uint)sVar7 & 0x7fffffff);
      }
      else {
        uVar13 = 0;
        if (-1 < iVar9) {
          do {
            if (z[uVar13 + 1] == '\0' && z[uVar13] == '\0') break;
            uVar13 = uVar13 + 2;
          } while ((int)uVar13 <= iVar9);
        }
      }
      n = (int)uVar13;
      uVar12 = uVar12 | 0x200;
    }
    uVar11 = (u16)uVar12;
    if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
      iVar6 = 0;
      if (uVar12 >> 9 != 0) {
        iVar6 = (enc != '\x01') + 1;
      }
      if (iVar9 < n) {
        if (psVar4 == (sqlite3 *)0x0) {
          return 0x12;
        }
        pPVar5 = psVar4->pParse;
        if (pPVar5 == (Parse *)0x0) {
          return 0x12;
        }
        pPVar5->rc = 0x12;
        pPVar5->nErr = pPVar5->nErr + 1;
        return 0x12;
      }
      uVar10 = iVar6 + n;
      uVar12 = 0x20;
      if (0x20 < uVar10) {
        uVar12 = uVar10;
      }
      if (pMem->szMalloc < (int)uVar12) {
        iVar6 = sqlite3VdbeMemGrow(pMem,uVar12,0);
        if (iVar6 != 0) {
          return 7;
        }
        __dest = pMem->z;
      }
      else {
        __dest = pMem->zMalloc;
        pMem->z = __dest;
        pMem->flags = pMem->flags & 0xd;
      }
      memcpy(__dest,z,(ulong)uVar10);
    }
    else {
      if (((pMem->flags & 0x2400) != 0) || (pMem->szMalloc != 0)) {
        vdbeMemClear(pMem);
      }
      pMem->z = z;
      if (xDel == sqlite3MallocSize) {
        pMem->zMalloc = z;
        psVar4 = pMem->db;
        if (((psVar4 == (sqlite3 *)0x0) || (z < (psVar4->lookaside).pStart)) ||
           ((psVar4->lookaside).pEnd <= z)) {
          uVar12 = (*sqlite3Config.m.xSize)(z);
        }
        else {
          uVar12 = (uint)(psVar4->lookaside).sz;
        }
        pMem->szMalloc = uVar12;
      }
      else {
        pMem->xDel = xDel;
        uVar11 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar11 + 0x400;
      }
    }
    pMem->n = n;
    pMem->flags = uVar11;
    uVar8 = '\x01';
    if (1 < enc) {
      uVar8 = enc;
    }
    pMem->enc = uVar8;
    if ((1 < enc) && (1 < n)) {
      cVar2 = *pMem->z;
      cVar3 = pMem->z[1];
      uVar8 = '\x02';
      if ((cVar3 == -2 && cVar2 == -1) || (uVar8 = '\x03', cVar3 == -1 && cVar2 == -2)) {
        iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
        if (iVar6 != 0) {
          return 7;
        }
        sVar7 = (long)pMem->n - 2;
        pMem->n = (int)sVar7;
        memmove(pMem->z,pMem->z + 2,sVar7);
        pMem->z[pMem->n] = '\0';
        pMem->z[(long)pMem->n + 1] = '\0';
        pbVar1 = (byte *)((long)&pMem->flags + 1);
        *pbVar1 = *pbVar1 | 2;
        pMem->enc = uVar8;
      }
    }
    iVar6 = 0x12;
    if (n <= iVar9) {
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = 0x7fffffff & (int)strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    u32 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}